

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O2

ZyanStatus
ZydisFormatterBasePrintAddressREL
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanStatus ZVar1;
  ZyanU8 ZVar2;
  ZydisPadding ZVar3;
  ZyanString *destination;
  ZyanU64 address;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x10a,
                  "ZyanStatus ZydisFormatterBasePrintAddressREL(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x10b,
                  "ZyanStatus ZydisFormatterBasePrintAddressREL(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x10c,
                  "ZyanStatus ZydisFormatterBasePrintAddressREL(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar1 = ZydisCalcAbsoluteAddress(context->instruction,context->operand,0,&address);
  if (-1 < (int)ZVar1) {
    ZVar3 = formatter->addr_padding_relative;
    if (ZVar3 == ZYDIS_PADDING_AUTO) {
      if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
        ZVar2 = context->instruction->address_width;
        if (ZVar2 == '@') {
          ZVar3 = 0x10;
        }
        else if (ZVar2 == ' ') {
          address = address & 0xffffffff;
          ZVar3 = 8;
        }
        else {
          if (ZVar2 != '\x10') {
            return 0x80100004;
          }
          address = address & 0xffff;
          ZVar3 = 4;
        }
      }
      else {
        ZVar3 = ZYDIS_PADDING_DISABLED;
      }
    }
    if ((buffer->is_token_list == '\0') ||
       (ZVar1 = ZydisFormatterBufferAppend(buffer,'\t'), -1 < (int)ZVar1)) {
      ZVar2 = (ZyanU8)ZVar3;
      if (formatter->addr_signedness < ZYDIS_SIGNEDNESS_MAX_VALUE) {
        if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
          ZVar1 = ZydisStringAppendHexS
                            (&buffer->string,address,ZVar2,formatter->hex_force_leading_number,
                             formatter->hex_uppercase,'\x01',formatter->number_format[1][0].string,
                             formatter->number_format[1][1].string);
        }
        else {
          if (formatter->addr_base != ZYDIS_NUMERIC_BASE_DEC) {
            return 0x80100004;
          }
          ZVar1 = ZydisStringAppendDecS
                            (&buffer->string,address,ZVar2,'\x01',
                             formatter->number_format[0][0].string,
                             formatter->number_format[0][1].string);
        }
      }
      else {
        if (formatter->addr_signedness != ZYDIS_SIGNEDNESS_MAX_VALUE) {
          return 0x80100004;
        }
        destination = &buffer->string;
        ZVar1 = ZydisStringAppendShort(destination,&STR_ADD);
        if ((int)ZVar1 < 0) {
          return ZVar1;
        }
        if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
          ZVar1 = ZydisStringAppendHexU
                            (destination,address,ZVar2,formatter->hex_force_leading_number,
                             formatter->hex_uppercase,formatter->number_format[1][0].string,
                             formatter->number_format[1][1].string);
        }
        else {
          if (formatter->addr_base != ZYDIS_NUMERIC_BASE_DEC) {
            return 0x80100004;
          }
          ZVar1 = ZydisStringAppendDecU
                            (destination,address,ZVar2,formatter->number_format[0][0].string,
                             formatter->number_format[0][1].string);
        }
      }
      if (-1 < (int)ZVar1) {
        ZVar1 = 0x100000;
      }
    }
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZydisFormatterBasePrintAddressREL(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZyanU64 address;
    ZYAN_CHECK(ZydisCalcAbsoluteAddress(context->instruction, context->operand, 0, &address));

    ZyanU8 padding = (formatter->addr_padding_relative ==
        ZYDIS_PADDING_AUTO) ? 0 : (ZyanU8)formatter->addr_padding_relative;
    if ((formatter->addr_padding_relative == ZYDIS_PADDING_AUTO) &&
        (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX))
    {
        switch (context->instruction->address_width)
        {
        case 16:
            padding =  4;
            address = (ZyanU16)address;
            break;
        case 32:
            padding =  8;
            address = (ZyanU32)address;
            break;
        case 64:
            padding = 16;
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_ADDRESS_REL);
    switch (formatter->addr_signedness)
    {
    case ZYDIS_SIGNEDNESS_AUTO:
    case ZYDIS_SIGNEDNESS_SIGNED:
        ZYDIS_STRING_APPEND_NUM_S(formatter, formatter->addr_base, &buffer->string, address,
            padding, formatter->hex_force_leading_number, ZYAN_TRUE);
        break;
    case ZYDIS_SIGNEDNESS_UNSIGNED:
        ZYAN_CHECK(ZydisStringAppendShort(&buffer->string, &STR_ADD));
        ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string, address,
            padding, formatter->hex_force_leading_number);
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}